

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O2

SUNErrCode SUNContext_SetProfiler(SUNContext sunctx,SUNProfiler profiler)

{
  SUNErrCode SVar1;
  
  SVar1 = -0x26f5;
  if (sunctx != (SUNContext)0x0) {
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SUNErrCode SUNContext_SetProfiler(SUNContext sunctx, SUNProfiler profiler)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);

#ifdef SUNDIALS_BUILD_WITH_PROFILING
  /* free any existing profiler */
  if (sunctx->profiler && sunctx->own_profiler)
  {
    SUNCheckCall(SUNProfiler_Free(&(sunctx->profiler)));
    sunctx->profiler = NULL;
  }

  /* set profiler */
  sunctx->profiler     = profiler;
  sunctx->own_profiler = SUNFALSE;
#else
  /* silence warnings when profiling is disabled */
  ((void)profiler);
#endif

  return SUN_SUCCESS;
}